

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

int al_ustr_compare(ALLEGRO_USTR *us1,ALLEGRO_USTR *us2)

{
  int32_t iVar1;
  int32_t iVar2;
  ALLEGRO_USTR *in_RSI;
  int32_t c2;
  int32_t c1;
  int pos2;
  int pos1;
  undefined4 uVar3;
  undefined4 uVar4;
  
  uVar4 = 0;
  uVar3 = 0;
  do {
    iVar1 = al_ustr_get_next(in_RSI,(int *)CONCAT44(uVar4,uVar3));
    iVar2 = al_ustr_get_next(in_RSI,(int *)CONCAT44(uVar4,uVar3));
    if (iVar1 != iVar2) {
      return iVar1 - iVar2;
    }
  } while (iVar1 != -1);
  return 0;
}

Assistant:

int al_ustr_compare(const ALLEGRO_USTR *us1, const ALLEGRO_USTR *us2)
{
   int pos1 = 0;
   int pos2 = 0;

   for (;;) {
      int32_t c1 = al_ustr_get_next(us1, &pos1);
      int32_t c2 = al_ustr_get_next(us2, &pos2);

      if (c1 != c2) {
         /* This happens to work even when one of c1 or c2 is -1. */
         return c1 - c2;
      }

      if (c1 == -1) /* == c2 */
         return 0;
   }
}